

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

ssize_t decode_length(uint32_t *res,size_t *shift_ptr,int *fin,uint32_t initial,size_t shift,
                     uint8_t *in,uint8_t *last,size_t prefix)

{
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  uint uVar4;
  
  *shift_ptr = 0;
  *fin = 0;
  pbVar1 = in;
  pbVar2 = in;
  if (initial == 0) {
    initial = ~(-1 << ((byte)prefix & 0x1f)) & 0xff;
    if ((*in & initial) == initial) {
      pbVar1 = in + 1;
      pbVar2 = pbVar1;
      if (pbVar1 != last) goto joined_r0x00630356;
      *res = initial;
    }
    else {
      *res = *in & initial;
      *fin = 1;
    }
    pbVar2 = (byte *)0x1;
  }
  else {
joined_r0x00630356:
    for (; pbVar1 != last; pbVar1 = pbVar1 + 1) {
      cVar3 = '\x01';
      if (shift < 0x20) {
        uVar4 = *pbVar1 & 0x7f;
        if ((uVar4 <= 0xffffffffU >> ((byte)shift & 0x1f)) &&
           (uVar4 = uVar4 << ((byte)shift & 0x1f), !CARRY4(uVar4,initial))) {
          cVar3 = (-1 < (char)*pbVar1) * '\x02';
          initial = uVar4 + initial;
        }
      }
      if (cVar3 != '\0') {
        pbVar2 = pbVar1;
        if (cVar3 != '\x02') {
          return -1;
        }
        break;
      }
      shift = shift + 7;
      pbVar2 = last;
    }
    *shift_ptr = shift;
    *res = initial;
    if (pbVar1 != last) {
      *fin = 1;
      pbVar2 = pbVar2 + (1 - (long)in);
    }
    else {
      pbVar2 = pbVar2 + -(long)in;
    }
  }
  return (ssize_t)pbVar2;
}

Assistant:

static ssize_t decode_length(uint32_t *res, size_t *shift_ptr, int *fin,
                             uint32_t initial, size_t shift, const uint8_t *in,
                             const uint8_t *last, size_t prefix) {
  uint32_t k = (uint8_t)((1 << prefix) - 1);
  uint32_t n = initial;
  const uint8_t *start = in;

  *shift_ptr = 0;
  *fin = 0;

  if (n == 0) {
    if ((*in & k) != k) {
      *res = (*in) & k;
      *fin = 1;
      return 1;
    }

    n = k;

    if (++in == last) {
      *res = n;
      return (ssize_t)(in - start);
    }
  }

  for (; in != last; ++in, shift += 7) {
    uint32_t add = *in & 0x7f;

    if (shift >= 32) {
      DEBUGF("inflate: shift exponent overflow\n");
      return -1;
    }

    if ((UINT32_MAX >> shift) < add) {
      DEBUGF("inflate: integer overflow on shift\n");
      return -1;
    }

    add <<= shift;

    if (UINT32_MAX - add < n) {
      DEBUGF("inflate: integer overflow on addition\n");
      return -1;
    }

    n += add;

    if ((*in & (1 << 7)) == 0) {
      break;
    }
  }

  *shift_ptr = shift;

  if (in == last) {
    *res = n;
    return (ssize_t)(in - start);
  }

  *res = n;
  *fin = 1;
  return (ssize_t)(in + 1 - start);
}